

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

void Gia_ManProfileStructuresInt(Gia_Man_t *p,int nLimit,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint i;
  Vec_Int_t *p_00;
  Vec_Int_t *vCode;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Gia_Man_t *pGVar4;
  int *__ptr;
  ulong uVar5;
  Gia_Man_t *p_04;
  ulong uVar6;
  int iVar7;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                  ,0x314,"void Gia_ManProfileStructuresInt(Gia_Man_t *, int, int)");
  }
  Gia_ManStaticFanoutStart(p);
  p_00 = Vec_IntAlloc(100);
  vCode = Vec_IntAlloc(p->nObjs * 5);
  p_01 = Vec_IntAlloc(p->nObjs);
  for (iVar7 = 0; iVar1 = p->nObjs, iVar7 < iVar1; iVar7 = iVar7 + 1) {
    pGVar3 = Gia_ManObj(p,iVar7);
    if (pGVar3 == (Gia_Obj_t *)0x0) {
      iVar1 = p->nObjs;
      break;
    }
    Vec_IntPush(p_01,vCode->nSize);
    iVar1 = Gia_ObjIsRi(p,pGVar3);
    if (iVar1 == 0) {
      uVar2 = Gia_ObjFaninNum(p,pGVar3);
      Gia_ObjFanoutNum(p,pGVar3);
      iVar7 = Gia_ManEncodeObj(p,iVar7);
      Vec_IntPush(vCode,iVar7);
      (*(code *)(&DAT_00802170 + *(int *)(&DAT_00802170 + (ulong)uVar2 * 4)))();
      return;
    }
  }
  if (p_01->nSize != iVar1) {
    __assert_fail("Vec_IntSize(vCodeOffsets) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                  ,0x348,"void Gia_ManProfileStructuresInt(Gia_Man_t *, int, int)");
  }
  Vec_IntPush(p_01,vCode->nSize);
  if (fVerbose != 0) {
    puts("Showing TFI/node/TFO structures for all nodes:");
    for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
      pGVar4 = p;
      pGVar3 = Gia_ManObj(p,iVar7);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      Gia_ManProfileCollect(pGVar4,iVar7,vCode,p_01,p_00);
      Gia_ManProfilePrintOne(p,iVar7,p_00);
    }
  }
  p_02 = Gia_ManProfileHash(p,vCode,p_01);
  uVar2 = Vec_IntFindMax(p_02);
  p_03 = Vec_IntStart(uVar2 + 1);
  pGVar4 = (Gia_Man_t *)Vec_IntStart(uVar2 + 1);
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar3 = Gia_ManObj(p,iVar7);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    i = Vec_IntEntry(p_02,iVar7);
    iVar1 = Gia_ObjIsRi(p,pGVar3);
    if (iVar1 == 0) {
      iVar1 = Vec_IntEntry(p_03,i);
      if (iVar1 == 0) {
        if (((int)i < 0) || (*(int *)((long)&pGVar4->pName + 4) <= (int)i)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(int *)((long)pGVar4->pSpec + (ulong)i * 4) = iVar7;
      }
      Vec_IntAddToEntry(p_03,i,-1);
    }
  }
  __ptr = Abc_MergeSortCost(p_03->pArray,p_03->nSize);
  printf("Showing TFI/node/TFO structures that appear more than %d times.\n",(ulong)(uint)nLimit);
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = 0;
  }
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    iVar7 = Vec_IntEntry(p_03,__ptr[uVar6]);
    if (-iVar7 < nLimit) break;
    printf("%6d : ",uVar6 & 0xffffffff);
    printf("%6d : ",(ulong)(uint)__ptr[uVar6]);
    iVar7 = Vec_IntEntry(p_03,__ptr[uVar6]);
    printf("Weight =%6d  ",(ulong)(uint)-iVar7);
    printf("First obj =");
    p_04 = pGVar4;
    iVar7 = Vec_IntEntry((Vec_Int_t *)pGVar4,__ptr[uVar6]);
    Gia_ManProfileCollect(p_04,iVar7,vCode,p_01,p_00);
    iVar7 = Vec_IntEntry((Vec_Int_t *)pGVar4,__ptr[uVar6]);
    Gia_ManProfilePrintOne(p,iVar7,p_00);
  }
  free(__ptr);
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  Vec_IntFree((Vec_Int_t *)pGVar4);
  Vec_IntFree(p_00);
  Vec_IntFree(vCode);
  Vec_IntFree(p_01);
  Gia_ManStaticFanoutStop(p);
  return;
}

Assistant:

void Gia_ManProfileStructuresInt( Gia_Man_t * p, int nLimit, int fVerbose )
{
    Vec_Int_t * vRes, * vCount, * vFirst;
    Vec_Int_t * vCode, * vCodeOffsets, * vArray;
    Gia_Obj_t * pObj, * pFanout;
    int i, k, nFanins, nFanouts, * pPerm, nClasses;
    assert( p->pMuxes );
    Gia_ManStaticFanoutStart( p );
    // create fanout codes
    vArray = Vec_IntAlloc( 100 );
    vCode = Vec_IntAlloc( 5 * Gia_ManObjNum(p) );
    vCodeOffsets = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        Vec_IntPush( vCodeOffsets, Vec_IntSize(vCode) );
        if ( Gia_ObjIsRi(p, pObj) )
            continue;
        nFanins = Gia_ObjFaninNum(p, pObj);
        nFanouts = Gia_ObjFanoutNum(p, pObj);
        Vec_IntPush( vCode, Gia_ManEncodeObj(p, i) );
        if ( nFanins == 3 )
        {
            int iLit = Gia_ObjFaninLit2p(p, pObj);
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Abc_LitRegular(iLit)) );
            if ( Abc_LitIsCompl(iLit) )
            {
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj)) );
            }
            else
            {
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj)) );
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
            }
        }
        else if ( nFanins == 2 )
        {
            int Code0 = Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj));
            int Code1 = Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj));
            Vec_IntPush( vCode, Code0 < Code1 ? Code0 : Code1 );
            Vec_IntPush( vCode, Code0 < Code1 ? Code1 : Code0 );
        }
        else if ( nFanins == 1 )
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
        else if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, Gia_ObjRoToRi(p, pObj))) );

        // add fanouts
        Vec_IntClear( vArray );
        Gia_ObjForEachFanoutStatic( p, pObj, pFanout, k )
        {
            int Index = Gia_ObjWhatFanin( p, pFanout, pObj );
            Gia_ObjType_t Type = Gia_ManEncodeFanout( p, pFanout, Index );
            Vec_IntPush( vArray, Type );
        }
        Vec_IntSort( vArray, 0 );
        Vec_IntAppend( vCode, vArray );
    }
    assert( Vec_IntSize(vCodeOffsets) == Gia_ManObjNum(p) );
    Vec_IntPush( vCodeOffsets, Vec_IntSize(vCode) );
    // print the results
    if ( fVerbose )
    {
        printf( "Showing TFI/node/TFO structures for all nodes:\n" );
        Gia_ManForEachObj( p, pObj, i )
        {
            Gia_ManProfileCollect( p, i, vCode, vCodeOffsets, vArray );
            Gia_ManProfilePrintOne( p, i, vArray );
        }
    }

    // collect statistics
    vRes = Gia_ManProfileHash( p, vCode, vCodeOffsets );
    //Vec_IntPrint( vRes );

    // count how many times each class appears
    nClasses = Vec_IntFindMax(vRes) + 1;
    vCount = Vec_IntStart( nClasses );
    vFirst = Vec_IntStart( nClasses );
    Gia_ManForEachObj( p, pObj, i )
    {
        int Entry = Vec_IntEntry( vRes, i );
        if ( Gia_ObjIsRi(p, pObj) )
            continue;
        if ( Vec_IntEntry(vCount, Entry) == 0 )
            Vec_IntWriteEntry( vFirst, Entry, i );
        Vec_IntAddToEntry( vCount, Entry, -1 );
    }
    // sort the counts
    pPerm = Abc_MergeSortCost( Vec_IntArray(vCount), Vec_IntSize(vCount) );
    printf( "Showing TFI/node/TFO structures that appear more than %d times.\n", nLimit );
    for ( i = 0; i < nClasses-1; i++ )
    {
        if ( nLimit > -Vec_IntEntry(vCount, pPerm[i]) )
            break;
        printf( "%6d : ", i );
        printf( "%6d : ", pPerm[i] );
        printf( "Weight =%6d  ",   -Vec_IntEntry(vCount, pPerm[i]) );
        printf( "First obj =" );
        // print the object
        Gia_ManProfileCollect( p, Vec_IntEntry(vFirst, pPerm[i]), vCode, vCodeOffsets, vArray );
        Gia_ManProfilePrintOne( p, Vec_IntEntry(vFirst, pPerm[i]), vArray );
    }

    // cleanup
    ABC_FREE( pPerm );
    Vec_IntFree( vRes );
    Vec_IntFree( vCount );
    Vec_IntFree( vFirst );

    Vec_IntFree( vArray );
    Vec_IntFree( vCode );
    Vec_IntFree( vCodeOffsets );
    Gia_ManStaticFanoutStop( p );
}